

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::quath> *value)

{
  bool bVar1;
  _Type in_RAX;
  half4 v;
  half4 local_18;
  
  local_18._M_elems = in_RAX;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
  }
  else {
    bVar1 = ReadBasicType(this,&local_18);
    if (!bVar1) {
      return false;
    }
    if (value->has_value_ == false) {
      value->has_value_ = true;
    }
    value->contained =
         (storage_t<tinyusdz::value::quath>)
         (((ulong)local_18._M_elems >> 0x20 & 0xffff) << 0x10 |
          (long)local_18._M_elems << 0x30 | (ulong)local_18._M_elems >> 0x10 & 0xffff |
         ((ulong)local_18._M_elems >> 0x30) << 0x20);
  }
  return true;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::quath> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::quath v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}